

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData * GenerateOperaSoftTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  undefined8 this;
  bool bVar1;
  Data *data;
  BitBuffer *bitstream;
  allocator<unsigned_char> local_11a;
  value_type local_119;
  Data local_118;
  allocator<unsigned_char> local_fa;
  value_type local_f9;
  Data local_f8;
  Sector *local_e0;
  Sector *sector8;
  Sector *sector7;
  Sector *sector;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  undefined1 local_a0 [8];
  BitstreamTrackBuilder bitbuf;
  Track *track_local;
  CylHead *cylhead_local;
  
  bitbuf.m_buffer._96_8_ = track;
  bVar1 = IsOperaSoftTrack(track);
  if (!bVar1) {
    __assert_fail("IsOperaSoftTrack(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x281,"TrackData GenerateOperaSoftTrack(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0,_250K,MFM);
  TrackBuilder::addTrackStart((TrackBuilder *)local_a0,false);
  this = bitbuf.m_buffer._96_8_;
  __end1 = Track::begin((Track *)bitbuf.m_buffer._96_8_);
  sector = (Sector *)Track::end((Track *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                *)&sector);
    if (!bVar1) break;
    sector7 = __gnu_cxx::
              __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
              operator*(&__end1);
    if ((sector7->header).sector == 8) {
      sector8 = Track::operator[]((Track *)bitbuf.m_buffer._96_8_,7);
      local_e0 = Track::operator[]((Track *)bitbuf.m_buffer._96_8_,8);
      TrackBuilder::addSectorUpToData((TrackBuilder *)local_a0,&local_e0->header,local_e0->dam);
      local_f9 = 'U';
      std::allocator<unsigned_char>::allocator(&local_fa);
      Data::vector(&local_f8,0x100,&local_f9,&local_fa);
      TrackBuilder::addBlock((TrackBuilder *)local_a0,&local_f8);
      Data::~Data(&local_f8);
      std::allocator<unsigned_char>::~allocator(&local_fa);
      BitstreamTrackBuilder::addCrc((BitstreamTrackBuilder *)local_a0,0x104);
      local_119 = 'N';
      std::allocator<unsigned_char>::allocator(&local_11a);
      Data::vector(&local_118,0x410,&local_119,&local_11a);
      TrackBuilder::addBlock((TrackBuilder *)local_a0,&local_118);
      Data::~Data(&local_118);
      std::allocator<unsigned_char>::~allocator(&local_11a);
      data = Sector::data_copy(sector8,0);
      TrackBuilder::addBlock((TrackBuilder *)local_a0,data);
    }
    else {
      TrackBuilder::addSector((TrackBuilder *)local_a0,sector7,0xf0);
    }
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  }
  bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_a0);
  TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
  BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

TrackData GenerateOperaSoftTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsOperaSoftTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    for (auto& sector : track)
    {
        if (sector.header.sector != 8)
            bitbuf.addSector(sector, 0xf0);
        else
        {
            auto& sector7 = track[7];
            auto& sector8 = track[8];

            bitbuf.addSectorUpToData(sector8.header, sector8.dam);
            bitbuf.addBlock(Data(256, 0x55));
            bitbuf.addCrc(4 + 256);
            bitbuf.addBlock(Data(0x512 - 256 - 2, 0x4e));
            bitbuf.addBlock(sector7.data_copy());
        }
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}